

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O3

Token * __thiscall
wabt::WastLexer::GetStringToken(Token *__return_storage_ptr__,WastLexer *this,WastParser *parser)

{
  byte bVar1;
  char *pcVar2;
  Location loc;
  int iVar3;
  byte *pbVar4;
  bool bVar5;
  byte *pbVar6;
  byte *pbVar7;
  int iVar8;
  uint uVar9;
  anon_class_8_1_8991fb9c column;
  undefined4 uStack_74;
  
  if (this->cursor_ < this->buffer_end_) {
    this->cursor_ = this->cursor_ + 1;
  }
  pbVar7 = (byte *)this->buffer_end_;
  pbVar4 = (byte *)this->cursor_;
  if (pbVar4 < pbVar7) {
    pcVar2 = this->token_start_;
    bVar5 = false;
    do {
      pbVar6 = pbVar4 + 1;
      this->cursor_ = (char *)pbVar6;
      bVar1 = *pbVar4;
      if (bVar1 == 10) {
        this->token_start_ = (char *)pbVar4;
        WastParser::Error(parser,0x1948fd);
        this->line_ = this->line_ + 1;
        pbVar7 = (byte *)this->buffer_end_;
        pbVar4 = (byte *)this->cursor_;
        this->line_start_ = (char *)pbVar4;
        bVar5 = true;
      }
      else {
        if (bVar1 == 0x5c) {
          if (pbVar6 < pbVar7) {
            pbVar6 = pbVar4 + 2;
            this->cursor_ = (char *)pbVar6;
            uVar9 = pbVar4[1] - 0x22;
            if (uVar9 < 0x3b) {
              if ((0x1f80ffc000U >> ((ulong)uVar9 & 0x3f) & 1) == 0) {
                if ((0x400000000000021U >> ((ulong)uVar9 & 0x3f) & 1) != 0) goto LAB_0015de7b;
                goto LAB_0015dde6;
              }
LAB_0015ddfe:
              if ((pbVar6 < pbVar7) && ((""[(ulong)*pbVar6 + 1] & 4U) != 0)) {
                this->cursor_ = (char *)(pbVar4 + 3);
                goto LAB_0015de7b;
              }
            }
            else {
LAB_0015dde6:
              uVar9 = pbVar4[1] - 0x61;
              if (uVar9 < 0x14) {
                if ((0x3fU >> (uVar9 & 0x1f) & 1) != 0) goto LAB_0015ddfe;
                if ((0xa2000U >> (uVar9 & 0x1f) & 1) != 0) goto LAB_0015de7b;
              }
            }
          }
          this->token_start_ = (char *)(pbVar6 + -2);
          WastParser::Error(parser,0x19490f,(char *)0x2);
          bVar5 = true;
        }
        else if (bVar1 == 0x22) {
          this->token_start_ = pcVar2;
          if (bVar5) {
            iVar8 = ((int)pcVar2 - *(int *)&this->line_start_) + 1;
            if (iVar8 < 2) {
              iVar8 = 1;
            }
            iVar3 = (*(int *)&this->cursor_ - *(int *)&this->line_start_) + 1;
            if (iVar3 < 2) {
              iVar3 = 1;
            }
            loc.filename.size_._4_4_ = (int)((this->filename_)._M_string_length >> 0x20);
            loc.filename._0_12_ = *(undefined1 (*) [12])&this->filename_;
            loc.field_1.field_0.line = this->line_;
            loc.field_1.field_0.first_column = iVar8;
            loc.field_1.field_0.last_column = iVar3;
            loc.field_1._12_4_ = uStack_74;
            Token::Token(__return_storage_ptr__,loc,First);
            return __return_storage_ptr__;
          }
          TextToken(__return_storage_ptr__,this,Text,0);
          return __return_storage_ptr__;
        }
LAB_0015de7b:
        pbVar7 = (byte *)this->buffer_end_;
        pbVar4 = (byte *)this->cursor_;
      }
    } while (pbVar4 < pbVar7);
  }
  BareToken(__return_storage_ptr__,this,Eof);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetStringToken(WastParser* parser) {
  const char* saved_token_start = token_start_;
  bool has_error = false;
  bool in_string = true;
  ReadChar();
  while (in_string) {
    switch (ReadChar()) {
      case kEof:
        return BareToken(TokenType::Eof);

      case '\n':
        token_start_ = cursor_ - 1;
        ERROR("newline in string");
        has_error = true;
        Newline();
        continue;

      case '"':
        in_string = false;
        break;

      case '\\': {
        switch (ReadChar()) {
          case 't':
          case 'n':
          case 'r':
          case '"':
          case '\'':
          case '\\':
            // Valid escape.
            break;

          case '0':
          case '1':
          case '2':
          case '3':
          case '4':
          case '5':
          case '6':
          case '7':
          case '8':
          case '9':
          case 'a':
          case 'b':
          case 'c':
          case 'd':
          case 'e':
          case 'f':
          case 'A':
          case 'B':
          case 'C':
          case 'D':
          case 'E':
          case 'F':  // Hex byte escape.
            if (IsHexDigit(PeekChar())) {
              ReadChar();
            } else {
              token_start_ = cursor_ - 2;
              goto error;
            }
            break;

          default:
            token_start_ = cursor_ - 2;
            goto error;

          error:
            ERROR("bad escape \"%.*s\"",
                  static_cast<int>(cursor_ - token_start_), token_start_);
            has_error = true;
            break;
        }
        break;
      }
    }
  }
  token_start_ = saved_token_start;
  if (has_error) {
    return Token(GetLocation(), TokenType::Invalid);
  }

  return TextToken(TokenType::Text);
}